

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddFocusEvent(ImGuiIO *this,bool focused)

{
  ImGuiContext *pIVar1;
  byte bVar2;
  ImGuiInputEvent *pIVar3;
  ImGuiInputEvent e;
  
  pIVar1 = GImGui;
  pIVar3 = FindLatestInputEvent(ImGuiInputEventType_Focus,-1);
  if (pIVar3 == (ImGuiInputEvent *)0x0) {
    bVar2 = (pIVar1->IO).AppFocusLost ^ 1;
  }
  else {
    bVar2 = (pIVar3->field_2).AppFocused.Focused;
  }
  if ((bool)bVar2 != focused) {
    e.AddedByTestEngine = false;
    e._21_3_ = 0;
    e.field_2._4_8_ = 0;
    e.Type = ImGuiInputEventType_Focus;
    e._4_8_ = (ulong)focused << 0x20;
    ImVector<ImGuiInputEvent>::push_back(&pIVar1->InputEventsQueue,&e);
  }
  return;
}

Assistant:

void ImGuiIO::AddFocusEvent(bool focused)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_Focus);
    const bool latest_focused = latest_event ? latest_event->AppFocused.Focused : !g.IO.AppFocusLost;
    if (latest_focused == focused)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Focus;
    e.AppFocused.Focused = focused;
    g.InputEventsQueue.push_back(e);
}